

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O0

void __thiscall YAJLMiscData::fetch_comment(YAJLMiscData *this,bitio_stream *bstream)

{
  char cVar1;
  ushort uVar2;
  ssize_t sVar3;
  size_t in_RCX;
  undefined1 in_DL;
  char extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 uVar4;
  undefined1 extraout_DL_01;
  undefined7 in_register_00000011;
  undefined7 extraout_var;
  undefined7 uVar5;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  int local_34;
  int i_1;
  u16 length_1;
  value_type pcStack_28;
  int i;
  char *com_data;
  bitio_stream *pbStack_18;
  u16 length;
  bitio_stream *bstream_local;
  YAJLMiscData *this_local;
  
  pbStack_18 = bstream;
  bstream_local = (bitio_stream *)this;
  if ((this->ignore & 1U) == 0) {
    sVar3 = bitio::bitio_stream::read
                      (bstream,0x10,(void *)CONCAT71(in_register_00000011,in_DL),in_RCX);
    com_data._6_2_ = (short)sVar3 - 2;
    pcStack_28 = (value_type)operator_new__((ulong)com_data._6_2_);
    cVar1 = extraout_DL;
    uVar5 = extraout_var;
    for (i_1 = 0; i_1 < (int)(uint)com_data._6_2_; i_1 = i_1 + 1) {
      sVar3 = bitio::bitio_stream::read
                        (pbStack_18,8,(void *)CONCAT71(uVar5,cVar1),(ulong)com_data._6_2_);
      cVar1 = (char)sVar3;
      pcStack_28[i_1] = cVar1;
      uVar5 = extraout_var_00;
    }
    std::vector<char_*,_std::allocator<char_*>_>::push_back
              (&this->comments,&stack0xffffffffffffffd8);
  }
  else {
    sVar3 = bitio::bitio_stream::read
                      (bstream,0x10,(void *)CONCAT71(in_register_00000011,in_DL),in_RCX);
    uVar2 = (short)sVar3 - 2;
    uVar4 = extraout_DL_00;
    uVar5 = extraout_var_01;
    for (local_34 = 0; local_34 < (int)(uint)uVar2; local_34 = local_34 + 1) {
      bitio::bitio_stream::read(pbStack_18,8,(void *)CONCAT71(uVar5,uVar4),(ulong)uVar2);
      uVar4 = extraout_DL_01;
      uVar5 = extraout_var_02;
    }
  }
  return;
}

Assistant:

void YAJLMiscData::fetch_comment(bitio::bitio_stream *bstream) {
    if (!ignore) {
        // param-length followed by comment-bytes.
        u16 length = bstream->read(0x10);
        length -= 2;
        auto *com_data = new char[length];
        for (int i = 0; i < length; i++) {
            com_data[i] = bstream->read(0x8);
        }
        comments.push_back(com_data);
    } else {
        u16 length = bstream->read(0x10);
        length -= 2;
        for (int i = 0; i < length; i++) {
            bstream->read(0x8);
        }
    }
}